

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  int iVar1;
  RtreeCell *in_RDX;
  Rtree *in_RSI;
  Rtree *in_RDI;
  long in_FS_OFFSET;
  RtreeNode *pParent;
  int rc;
  int cnt;
  RtreeNode *p;
  int iCell;
  RtreeCell cell;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Rtree *pCell_00;
  int iVar2;
  uint uVar3;
  Rtree *pRtree_00;
  int local_40;
  RtreeCell local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  iVar2 = -0x55555556;
  pCell_00 = in_RSI;
  do {
    pRtree_00 = pCell_00;
    if ((pRtree_00->base).pModule == (sqlite3_module *)0x0) {
      local_40 = 0;
LAB_0029e5e1:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_40;
    }
    pCell_00 = (Rtree *)(pRtree_00->base).pModule;
    memcpy(&local_38,&DAT_002b1188,0x30);
    uVar3 = uVar3 + 1;
    if (100 < (int)uVar3) {
      local_40 = 0x10b;
      goto LAB_0029e5e1;
    }
    iVar2 = nodeParentIndex((Rtree *)CONCAT44(uVar3,iVar2),(RtreeNode *)pCell_00,
                            (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (iVar2 != 0) {
      local_40 = 0x10b;
      goto LAB_0029e5e1;
    }
    nodeGetCell(in_RSI,(RtreeNode *)in_RDX,(int)((ulong)pRtree_00 >> 0x20),
                (RtreeCell *)((ulong)uVar3 << 0x20));
    iVar1 = cellContains(in_RDI,&local_38,in_RDX);
    if (iVar1 == 0) {
      cellUnion(in_RDI,&local_38,in_RDX);
      nodeOverwriteCell(pRtree_00,(RtreeNode *)CONCAT44(uVar3,iVar2),(RtreeCell *)pCell_00,
                        in_stack_ffffffffffffff8c);
    }
  } while( true );
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  int cnt = 0;
  int rc;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    cnt++;
    if( NEVER(cnt>100) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }
    rc = nodeParentIndex(pRtree, p, &iCell);
    if( NEVER(rc!=SQLITE_OK) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }

    p = pParent;
  }
  return SQLITE_OK;
}